

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afloader.c
# Opt level: O1

FT_Error af_loader_embolden_glyph_in_slot
                   (AF_Loader loader,FT_Face face,AF_StyleMetrics_conflict style_metrics)

{
  FT_UShort FVar1;
  FT_UShort FVar2;
  int iVar3;
  AF_FaceGlobals pAVar4;
  FT_Size_Internal pFVar5;
  AF_WritingSystemClass pAVar6;
  FT_Fixed FVar7;
  long lVar8;
  FT_Long FVar9;
  AF_WritingSystemClass extraout_RAX;
  FT_Outline *outline;
  FT_Pos stdHW;
  FT_Pos stdVW;
  FT_Matrix scale_down_matrix;
  FT_Pos local_78;
  FT_Pos local_70;
  AF_Loader local_68;
  FT_GlyphSlot local_60;
  FT_Matrix local_58;
  
  local_60 = face->glyph;
  pAVar4 = loader->globals;
  pFVar5 = face->size->internal;
  pAVar6 = (AF_WritingSystemClass)0x0;
  local_70 = 0;
  local_78 = 0;
  FVar1 = (pFVar5->autohint_metrics).x_ppem;
  FVar2 = pAVar4->stem_darkening_for_ppem;
  iVar3._0_2_ = face->units_per_EM;
  iVar3._2_2_ = face->ascender;
  local_58.yx = 0;
  local_58.yy = 0x10000;
  local_58.xx._0_4_ = 0x10000;
  local_58.xx._4_4_ = 0;
  local_58.xy._0_4_ = 0;
  local_58.xy._4_4_ = 0;
  if ((undefined2)iVar3 != 0) {
    pAVar6 = af_writing_system_classes[style_metrics->style_class->writing_system];
    if (pAVar6->style_metrics_getstdw != (AF_WritingSystem_GetStdWidthsFunc)0x0) {
      local_68 = loader;
      (*pAVar6->style_metrics_getstdw)(style_metrics,&local_78,&local_70);
      if ((FVar1 != FVar2) || ((0 < local_70 && (local_70 != pAVar4->standard_vertical_width)))) {
        FVar7 = af_loader_compute_darkening(local_68,face,local_70);
        lVar8 = (long)(int)FVar7 * (long)(int)(pFVar5->autohint_metrics).x_scale;
        pAVar4->standard_vertical_width = local_70;
        pAVar4->stem_darkening_for_ppem = (pFVar5->autohint_metrics).x_ppem;
        pAVar4->darken_x = ((lVar8 >> 0x3f) + lVar8) * 0x10000 + 0x800080000000 >> 0x30;
      }
      if ((FVar1 != FVar2) || ((0 < local_78 && (local_78 != pAVar4->standard_horizontal_width)))) {
        FVar7 = af_loader_compute_darkening(local_68,face,local_78);
        lVar8 = (long)(int)FVar7 * (long)(int)(pFVar5->autohint_metrics).y_scale;
        pAVar4->standard_horizontal_width = local_78;
        pAVar4->stem_darkening_for_ppem = (pFVar5->autohint_metrics).x_ppem;
        pAVar4->darken_y = ((lVar8 >> 0x3f) + lVar8) * 0x10000 + 0x800080000000 >> 0x30;
        FVar9 = FT_DivFix(((ulong)(uint)(iVar3 << 0x10) - FVar7) + -0x80000,
                          (ulong)(uint)(iVar3 << 0x10));
        pAVar4->scale_down_factor = FVar9;
      }
      outline = &local_60->outline;
      FT_Outline_EmboldenXY(outline,pAVar4->darken_x,pAVar4->darken_y);
      local_58.yy = pAVar4->scale_down_factor;
      FT_Outline_Transform(outline,&local_58);
      pAVar6 = extraout_RAX;
    }
  }
  return (FT_Error)pAVar6;
}

Assistant:

static FT_Error
  af_loader_embolden_glyph_in_slot( AF_Loader        loader,
                                    FT_Face          face,
                                    AF_StyleMetrics  style_metrics )
  {
    FT_Error  error = FT_Err_Ok;

    FT_GlyphSlot           slot    = face->glyph;
    AF_FaceGlobals         globals = loader->globals;
    AF_WritingSystemClass  writing_system_class;

    FT_Size_Metrics*  size_metrics = &face->size->internal->autohint_metrics;

    FT_Pos  stdVW = 0;
    FT_Pos  stdHW = 0;

    FT_Bool  size_changed = size_metrics->x_ppem !=
                              globals->stem_darkening_for_ppem;

    FT_Fixed  em_size  = af_intToFixed( face->units_per_EM );

    FT_Matrix  scale_down_matrix = { 0x10000L, 0, 0, 0x10000L };


    /* Skip stem darkening for broken fonts. */
    if ( !face->units_per_EM )
    {
      error = FT_ERR( Corrupted_Font_Header );
      goto Exit;
    }

    /*
     * We depend on the writing system (script analyzers) to supply
     * standard widths for the script of the glyph we are looking at.  If
     * it can't deliver, stem darkening is disabled.
     */
    writing_system_class =
      af_writing_system_classes[style_metrics->style_class->writing_system];

    if ( writing_system_class->style_metrics_getstdw )
      writing_system_class->style_metrics_getstdw( style_metrics,
                                                   &stdHW,
                                                   &stdVW );
    else
    {
      error = FT_ERR( Unimplemented_Feature );
      goto Exit;
    }

    if ( size_changed                                               ||
         ( stdVW > 0 && stdVW != globals->standard_vertical_width ) )
    {
      FT_Fixed  darken_by_font_units_x, darken_x;


      darken_by_font_units_x =
         af_loader_compute_darkening( loader,
                                      face,
                                      stdVW ) ;
      darken_x = FT_MulFix( darken_by_font_units_x,
                            size_metrics->x_scale );

      globals->standard_vertical_width = stdVW;
      globals->stem_darkening_for_ppem = size_metrics->x_ppem;
      globals->darken_x                = af_fixedToInt( darken_x );
    }

    if ( size_changed                                                 ||
         ( stdHW > 0 && stdHW != globals->standard_horizontal_width ) )
    {
      FT_Fixed  darken_by_font_units_y, darken_y;


      darken_by_font_units_y =
         af_loader_compute_darkening( loader,
                                      face,
                                      stdHW ) ;
      darken_y = FT_MulFix( darken_by_font_units_y,
                            size_metrics->y_scale );

      globals->standard_horizontal_width = stdHW;
      globals->stem_darkening_for_ppem   = size_metrics->x_ppem;
      globals->darken_y                  = af_fixedToInt( darken_y );

      /*
       * Scale outlines down on the Y-axis to keep them inside their blue
       * zones.  The stronger the emboldening, the stronger the downscaling
       * (plus heuristical padding to prevent outlines still falling out
       * their zones due to rounding).
       *
       * Reason: `FT_Outline_Embolden' works by shifting the rightmost
       * points of stems farther to the right, and topmost points farther
       * up.  This positions points on the Y-axis outside their
       * pre-computed blue zones and leads to distortion when applying the
       * hints in the code further below.  Code outside this emboldening
       * block doesn't know we are presenting it with modified outlines the
       * analyzer didn't see!
       *
       * An unfortunate side effect of downscaling is that the emboldening
       * effect is slightly decreased.  The loss becomes more pronounced
       * versus the CFF driver at smaller sizes, e.g., at 9ppem and below.
       */
      globals->scale_down_factor =
        FT_DivFix( em_size - ( darken_by_font_units_y + af_intToFixed( 8 ) ),
                   em_size );
    }

    FT_Outline_EmboldenXY( &slot->outline,
                           globals->darken_x,
                           globals->darken_y );

    scale_down_matrix.yy = globals->scale_down_factor;
    FT_Outline_Transform( &slot->outline, &scale_down_matrix );

  Exit:
    return error;
  }